

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall
google::protobuf::UnknownFieldSet::MergeFrom(UnknownFieldSet *this,UnknownFieldSet *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pUVar4;
  Arena *arena;
  UnknownField value;
  undefined1 local_48 [8];
  UnknownField elem;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedField<google::protobuf::UnknownField> *__range3;
  int other_field_count;
  UnknownFieldSet *other_local;
  UnknownFieldSet *this_local;
  
  iVar2 = field_count(other);
  if (0 < iVar2) {
    iVar3 = RepeatedField<google::protobuf::UnknownField>::size(&this->fields_);
    RepeatedField<google::protobuf::UnknownField>::Reserve(&this->fields_,iVar3 + iVar2);
    __end3 = RepeatedField<google::protobuf::UnknownField>::begin(&other->fields_);
    elem.data_ = (anon_union_8_5_2195ba05_for_data_)
                 RepeatedField<google::protobuf::UnknownField>::end(&other->fields_);
    while (bVar1 = internal::operator!=(&__end3,(iterator *)&elem.data_), bVar1) {
      pUVar4 = internal::RepeatedIterator<const_google::protobuf::UnknownField>::operator*(&__end3);
      local_48._0_4_ = pUVar4->number_;
      local_48._4_4_ = pUVar4->type_;
      elem._0_8_ = pUVar4->data_;
      arena = UnknownFieldSet::arena(this);
      value = UnknownField::DeepCopy((UnknownField *)local_48,arena);
      RepeatedField<google::protobuf::UnknownField>::Add(&this->fields_,value);
      internal::RepeatedIterator<const_google::protobuf::UnknownField>::operator++(&__end3);
    }
  }
  return;
}

Assistant:

void UnknownFieldSet::MergeFrom(const UnknownFieldSet& other) {
  int other_field_count = other.field_count();
  if (other_field_count > 0) {
    fields_.Reserve(fields_.size() + other_field_count);
    for (auto elem : other.fields_) {
      fields_.Add(elem.DeepCopy(arena()));
    }
  }
}